

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,5ul>,(wasm::
Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::
function<void(wasm::Function*,wasm::SmallUnorderedSet<wasm::HeapType,5ul>&)>)::Mapper::Mapper(wasm::
Module&,std::map<wasm::Function*,wasm::SmallUnorderedSet<wasm::HeapType,5ul>,std::less<wasm::
Function*>,std::allocator<std::pair<wasm::Function*const,wasm::SmallUnorderedSet<wasm::
HeapType,5ul>>>>&,std::function<void(wasm::Function*,wasm::SmallUnorderedSet<wasm::HeapType_5ul>__>_
          (void *this,Module *module,Map *map,Func *work)

{
  Func *work_local;
  Map *map_local;
  Module *module_local;
  Mapper *this_local;
  
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_0271ae80;
  *(Module **)((long)this + 0x108) = module;
  *(Map **)((long)this + 0x110) = map;
  std::function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)>::function
            ((function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             ((long)this + 0x118),
             (function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}